

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf64.c
# Opt level: O1

void elf64_symbols(GlobalVars *gv,Elf64_Ehdr *ehdr,ObjectUnit *ou,Elf64_Shdr *shdr)

{
  byte bVar1;
  LinkFile *lf;
  char *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  uint16_t uVar6;
  uint32_t uVar7;
  uint32_t shtype;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  char *pcVar11;
  uint uVar12;
  uchar *p;
  uint8_t *symname;
  bool bVar13;
  ulong local_80;
  
  bVar13 = ehdr->e_ident[5] == '\x02';
  lf = ou->lnkfile;
  uVar12 = (uint)bVar13;
  uVar8 = read64(uVar12,shdr->sh_offset);
  uVar9 = read64(uVar12,shdr->sh_entsize);
  uVar10 = read64(uVar12,shdr->sh_size);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar9;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar10;
  local_80 = SUB168(auVar4 / auVar3,0);
  uVar7 = read32(uVar12,shdr->sh_link);
  pcVar11 = elf64_strtab(lf,ehdr,uVar7);
  uVar10 = read64(uVar12,shdr->sh_size);
  elf_check_offset(lf,"symbol",ehdr->e_ident + uVar8,uVar10);
  if (1 < SUB164(auVar4 / auVar3,0)) {
    p = ehdr->e_type + uVar8 + uVar9;
    do {
      uVar12 = (uint)bVar13;
      uVar7 = read32(uVar12,(Elf64_Ehdr *)(p + -0x10));
      symname = (uint8_t *)(pcVar11 + uVar7);
      if ((symname < lf->data) || (lf->data + lf->length < symname)) {
        pcVar2 = lf->pathname;
        uVar7 = read32(uVar12,(Elf64_Ehdr *)(p + -0x10));
        error(0x7f,pcVar2,(ulong)uVar7,lf->objname);
      }
      uVar7 = read32(uVar12,shdr->sh_type);
      uVar6 = read16(uVar12,p + -10);
      shtype = read32(uVar12,shdr->sh_type);
      bVar1 = p[-0xc];
      uVar8 = read64(uVar12,p + -8);
      uVar10 = read64(uVar12,p);
      elf_add_symbol(gv,ou,(char *)symname,(uVar7 == 0xb) << 4,(uint)uVar6,shtype,bVar1 & 0xf,
                     bVar1 >> 4,uVar8,(uint32_t)uVar10);
      p = p + uVar9;
      iVar5 = (int)local_80;
      local_80 = (ulong)(iVar5 - 1);
    } while (2 < iVar5);
  }
  return;
}

Assistant:

static void elf64_symbols(struct GlobalVars *gv,struct Elf64_Ehdr *ehdr,
                   struct ObjectUnit *ou,struct Elf64_Shdr *shdr)
/* convert ELF symbol definitions into internal format */
{
  bool be = (ehdr->e_ident[EI_DATA] == ELFDATA2MSB);
  struct LinkFile *lf = ou->lnkfile;
  uint8_t *data = (uint8_t *)ehdr + read64(be,shdr->sh_offset);
  unsigned long entsize = read64(be,shdr->sh_entsize);
  int nsyms = (int)(read64(be,shdr->sh_size) / (uint64_t)entsize);
  char *strtab = elf64_strtab(lf,ehdr,read32(be,shdr->sh_link));

  elf_check_offset(lf,"symbol",data,read64(be,shdr->sh_size));

  /* read ELF xdef symbols and convert to internal format */
  while (--nsyms > 0) {
    struct Elf64_Sym *elfsym;
    char *symname;

    elfsym = (struct Elf64_Sym *)(data += entsize);
    symname = strtab + read32(be,elfsym->st_name);
    if (symname<(char *)lf->data || symname>(char *)lf->data+lf->length)
      error(127,lf->pathname,read32(be,elfsym->st_name),lf->objname);

    elf_add_symbol(gv,ou,symname,
                   (read32(be,shdr->sh_type)==SHT_DYNSYM) ? SYMF_SHLIB : 0,
                   read16(be,elfsym->st_shndx),
                   read32(be,shdr->sh_type),
                   ELF64_ST_TYPE(*elfsym->st_info),
                   ELF64_ST_BIND(*elfsym->st_info),
                   read64(be,elfsym->st_value),
                   read64(be,elfsym->st_size));
  }
}